

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_allocator.cpp
# Opt level: O2

void __thiscall duckdb::ArenaChunk::~ArenaChunk(ArenaChunk *this)

{
  _Head_base<0UL,_duckdb::ArenaChunk_*,_false> _Var1;
  type current_next;
  _Head_base<0UL,_duckdb::ArenaChunk_*,_false> local_20;
  
  _Var1._M_head_impl =
       (this->next).super_unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>.
       _M_t.super___uniq_ptr_impl<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>._M_t
       .super__Tuple_impl<0UL,_duckdb::ArenaChunk_*,_std::default_delete<duckdb::ArenaChunk>_>.
       super__Head_base<0UL,_duckdb::ArenaChunk_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (ArenaChunk *)0x0) {
    (this->next).super_unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>._M_t
    .super___uniq_ptr_impl<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::ArenaChunk_*,_std::default_delete<duckdb::ArenaChunk>_>.
    super__Head_base<0UL,_duckdb::ArenaChunk_*,_false>._M_head_impl = (ArenaChunk *)0x0;
    local_20._M_head_impl = _Var1._M_head_impl;
    while (local_20._M_head_impl != (ArenaChunk *)0x0) {
      ::std::__uniq_ptr_impl<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>::
      operator=((__uniq_ptr_impl<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_> *)
                &local_20,
                (__uniq_ptr_impl<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_> *)
                &(local_20._M_head_impl)->next);
    }
    ::std::unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>::~unique_ptr
              ((unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_> *)&local_20
              );
  }
  ::std::unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>::~unique_ptr
            (&(this->next).
              super_unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>);
  AllocatedData::~AllocatedData(&this->data);
  return;
}

Assistant:

ArenaChunk::~ArenaChunk() {
	if (next) {
		auto current_next = std::move(next);
		while (current_next) {
			current_next = std::move(current_next->next);
		}
	}
}